

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::DecodeBbrDataset
                  (Error *__return_storage_ptr__,BbrDataset *aDataset,Response *aResponse)

{
  bool bVar1;
  bool bVar2;
  Error *pEVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  ByteArray *aRawAddr;
  string local_1e8;
  ErrorCode local_1c4;
  Error local_1c0;
  undefined1 local_198 [8];
  Address addr;
  undefined1 local_178 [8];
  mapped_type registrarIpv6Addr;
  key_type local_141;
  undefined1 local_140 [8];
  mapped_type registrarHostname;
  key_type local_109;
  undefined1 local_108 [8];
  mapped_type triHostname;
  Error local_e8;
  undefined1 local_c0 [8];
  BbrDataset dataset;
  TlvSet tlvSet;
  Response *aResponse_local;
  BbrDataset *aDataset_local;
  Error *error;
  
  bVar1 = false;
  Error::Error(__return_storage_ptr__);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&dataset.mPresentFlags);
  BbrDataset::BbrDataset((BbrDataset *)local_c0);
  GetTlvSet(&local_e8,(TlvSet *)&dataset.mPresentFlags,aResponse,kMeshCoP);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_e8);
  triHostname.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._0_4_ = 0;
  bVar2 = commissioner::operator!=
                    (pEVar3,(ErrorCode *)
                            &triHostname.
                             super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
  Error::~Error(&local_e8);
  if (!bVar2) {
    local_109 = kTriHostname;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mPresentFlags,&local_109);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_108,pmVar4);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_108);
    if (bVar2) {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_108);
      tlv::Tlv::GetValueAsString_abi_cxx11_
                ((string *)
                 &registrarHostname.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,peVar5);
      std::__cxx11::string::operator=
                ((string *)local_c0,
                 (string *)
                 &registrarHostname.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &registrarHostname.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      dataset.mRegistrarIpv6Addr.field_2._8_2_ = dataset.mRegistrarIpv6Addr.field_2._8_2_ | 0x8000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_108);
    local_141 = kRegistrarHostname;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mPresentFlags,&local_141);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_140,pmVar4);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_140);
    if (bVar2) {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      tlv::Tlv::GetValueAsString_abi_cxx11_
                ((string *)
                 &registrarIpv6Addr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,peVar5);
      std::__cxx11::string::operator=
                ((string *)(dataset.mTriHostname.field_2._M_local_buf + 8),
                 (string *)
                 &registrarIpv6Addr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &registrarIpv6Addr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      dataset.mRegistrarIpv6Addr.field_2._8_2_ = dataset.mRegistrarIpv6Addr.field_2._8_2_ | 0x4000;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_140);
    addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0x44;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&dataset.mPresentFlags,
                          (key_type *)
                          ((long)&addr.mBytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_178,pmVar4);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_178);
    if (bVar2) {
      Address::Address((Address *)local_198);
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_178);
      aRawAddr = tlv::Tlv::GetValue(peVar5);
      Address::Set(&local_1c0,(Address *)local_198,aRawAddr);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_1c0);
      local_1c4 = kNone;
      bVar2 = commissioner::operator!=(pEVar3,&local_1c4);
      Error::~Error(&local_1c0);
      if (!bVar2) {
        Address::ToString_abi_cxx11_(&local_1e8,(Address *)local_198);
        std::__cxx11::string::operator=
                  ((string *)(dataset.mRegistrarHostname.field_2._M_local_buf + 8),
                   (string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        dataset.mRegistrarIpv6Addr.field_2._8_2_ = dataset.mRegistrarIpv6Addr.field_2._8_2_ | 0x2000
        ;
      }
      Address::~Address((Address *)local_198);
      if (!bVar2) goto LAB_0027d655;
    }
    else {
LAB_0027d655:
      bVar2 = false;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_178);
    if (bVar2) {
      if (!bVar2) goto LAB_0027d6ac;
    }
    else {
      BbrDataset::operator=(aDataset,(BbrDataset *)local_c0);
    }
  }
  bVar1 = true;
LAB_0027d6ac:
  BbrDataset::~BbrDataset((BbrDataset *)local_c0);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&dataset.mPresentFlags);
  if (!bVar1) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeBbrDataset(BbrDataset &aDataset, const coap::Response &aResponse)
{
    Error       error;
    tlv::TlvSet tlvSet;
    BbrDataset  dataset;

    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto triHostname = tlvSet[tlv::Type::kTriHostname])
    {
        dataset.mTriHostname = triHostname->GetValueAsString();
        dataset.mPresentFlags |= BbrDataset::kTriHostnameBit;
    }

    if (auto registrarHostname = tlvSet[tlv::Type::kRegistrarHostname])
    {
        dataset.mRegistrarHostname = registrarHostname->GetValueAsString();
        dataset.mPresentFlags |= BbrDataset::kRegistrarHostnameBit;
    }

    if (auto registrarIpv6Addr = tlvSet[tlv::Type::kRegistrarIpv6Address])
    {
        Address addr;

        SuccessOrExit(error = addr.Set(registrarIpv6Addr->GetValue()));

        dataset.mRegistrarIpv6Addr = addr.ToString();
        dataset.mPresentFlags |= BbrDataset::kRegistrarIpv6AddrBit;
    }

    aDataset = dataset;

exit:
    return error;
}